

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

void new_token(Grammar *g,char *s,char *e)

{
  Term **ppTVar1;
  uint uVar2;
  Term **ppTVar3;
  Term *elem;
  char *__dest;
  anon_struct_40_4_d8687ec6_for_terminals *v;
  size_t __n;
  
  elem = (Term *)calloc(1,0x38);
  __n = (long)e - (long)s;
  __dest = (char *)malloc(__n + 1);
  elem->string = __dest;
  memcpy(__dest,s,__n);
  __dest[__n] = '\0';
  elem->string_len = (int)__n;
  ppTVar3 = (g->terminals).v;
  ppTVar1 = (g->terminals).e;
  if (ppTVar3 == (Term **)0x0) {
    (g->terminals).v = ppTVar1;
    uVar2 = (g->terminals).n;
    (g->terminals).n = uVar2 + 1;
    (g->terminals).e[uVar2] = elem;
    goto LAB_001390c2;
  }
  v = &g->terminals;
  uVar2 = v->n;
  if (ppTVar3 == ppTVar1) {
    if (2 < uVar2) goto LAB_001390b7;
  }
  else if ((uVar2 & 7) == 0) {
LAB_001390b7:
    vec_add_internal(v,elem);
    goto LAB_001390c2;
  }
  v->n = uVar2 + 1;
  ppTVar3[uVar2] = elem;
LAB_001390c2:
  elem->kind = TERM_TOKEN;
  return;
}

Assistant:

void new_token(Grammar *g, char *s, char *e) {
  Term *t = new_term();
  t->string = MALLOC(e - s + 1);
  memcpy(t->string, s, e - s);
  t->string[e - s] = 0;
  t->string_len = e - s;
  vec_add(&g->terminals, t);
  t->kind = TERM_TOKEN;
}